

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::ContractionsAndExpansions::handleContractions
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  UChar *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  uint32_t uVar4;
  UnicodeString *pUVar5;
  ConstChar16Ptr local_a8;
  undefined1 local_a0 [8];
  Iterator suffixes;
  UChar *p;
  uint32_t ce32_local;
  UChar32 end_local;
  UChar32 start_local;
  ContractionsAndExpansions *this_local;
  
  pUVar1 = this->data->contexts;
  iVar3 = Collation::indexFromCE32(ce32);
  suffixes.stack_ = (UVector32 *)(pUVar1 + iVar3);
  if ((ce32 & 0x100) == 0) {
    uVar4 = CollationData::readCE32((UChar *)suffixes.stack_);
    handleCE32(this,start,end,uVar4);
  }
  ConstChar16Ptr::ConstChar16Ptr
            (&local_a8,(char16_t *)((long)&((suffixes.stack_)->super_UObject)._vptr_UObject + 4));
  UCharsTrie::Iterator::Iterator((Iterator *)local_a0,&local_a8,0,&this->errorCode);
  ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
  while (UVar2 = UCharsTrie::Iterator::next((Iterator *)local_a0,&this->errorCode), UVar2 != '\0') {
    pUVar5 = UCharsTrie::Iterator::getString((Iterator *)local_a0);
    this->suffix = pUVar5;
    addStrings(this,start,end,this->contractions);
    UVar2 = UnicodeString::isEmpty(&this->unreversedPrefix);
    if (UVar2 == '\0') {
      addStrings(this,start,end,this->expansions);
    }
    uVar4 = UCharsTrie::Iterator::getValue((Iterator *)local_a0);
    handleCE32(this,start,end,uVar4);
  }
  this->suffix = (UnicodeString *)0x0;
  UCharsTrie::Iterator::~Iterator((Iterator *)local_a0);
  return;
}

Assistant:

void
ContractionsAndExpansions::handleContractions(
        UChar32 start, UChar32 end, uint32_t ce32) {
    const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
    if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
        // No match on the single code point.
        // We are underneath a prefix, and the default mapping is just
        // a fallback to the mappings for a shorter prefix.
        U_ASSERT(!unreversedPrefix.isEmpty());
    } else {
        ce32 = CollationData::readCE32(p);  // Default if no suffix match.
        U_ASSERT(!Collation::isContractionCE32(ce32));
        handleCE32(start, end, ce32);
    }
    UCharsTrie::Iterator suffixes(p + 2, 0, errorCode);
    while(suffixes.next(errorCode)) {
        suffix = &suffixes.getString();
        addStrings(start, end, contractions);
        if(!unreversedPrefix.isEmpty()) {
            addStrings(start, end, expansions);
        }
        handleCE32(start, end, (uint32_t)suffixes.getValue());
    }
    suffix = NULL;
}